

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O2

int64_t __thiscall indk::NeuralNet::getSignalBufferSize(NeuralNet *this)

{
  int64_t iVar1;
  _Base_ptr p_Var2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  lVar4 = -1;
  for (p_Var2 = (this->Neurons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->Neurons)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    iVar1 = Neuron::getSignalBufferSize(*(Neuron **)(p_Var2 + 2));
    lVar3 = lVar4;
    if (iVar1 < lVar4) {
      lVar3 = iVar1;
    }
    bVar5 = lVar4 == -1;
    lVar4 = lVar3;
    if (bVar5) {
      lVar4 = iVar1;
    }
  }
  return lVar4;
}

Assistant:

int64_t indk::NeuralNet::getSignalBufferSize() {
    int64_t size = -1;
    for (auto &n: Neurons) {
        auto nbsize = n.second -> getSignalBufferSize();
        if (size != -1 && nbsize >= size) continue;
        size = nbsize;
    }
    return size;
}